

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O2

Box * __thiscall amrex::MFIter::growntilebox(Box *__return_storage_ptr__,MFIter *this,IntVect *ng)

{
  int iVar1;
  int d;
  long lVar2;
  Box local_34;
  
  tilebox(__return_storage_ptr__,this);
  validbox(&local_34,this);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    iVar1 = (__return_storage_ptr__->smallend).vect[lVar2];
    if (iVar1 == local_34.smallend.vect[lVar2]) {
      (__return_storage_ptr__->smallend).vect[lVar2] = iVar1 - ng->vect[lVar2];
    }
    iVar1 = (__return_storage_ptr__->bigend).vect[lVar2];
    if (iVar1 == local_34.bigend.vect[lVar2]) {
      (__return_storage_ptr__->bigend).vect[lVar2] = iVar1 + ng->vect[lVar2];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Box
MFIter::growntilebox (const IntVect& ng) const noexcept
{
    Box bx = tilebox();
    const Box& vbx = validbox();
    for (int d=0; d<AMREX_SPACEDIM; ++d) {
        if (bx.smallEnd(d) == vbx.smallEnd(d)) {
            bx.growLo(d, ng[d]);
        }
        if (bx.bigEnd(d) == vbx.bigEnd(d)) {
            bx.growHi(d, ng[d]);
        }
    }
    return bx;
}